

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv2022.cpp
# Opt level: O3

void UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,UErrorCode *err)

{
  UBool useFallback;
  byte bVar1;
  void *pvVar2;
  char *pcVar3;
  UChar *pUVar4;
  UErrorCode *pUVar5;
  UConverterSharedData *source;
  UErrorCode UVar6;
  int iVar7;
  int32_t *offsets;
  int *piVar8;
  long lVar9;
  char cVar10;
  int8_t iVar11;
  UChar *pUVar12;
  uint uVar13;
  int iVar14;
  char *pcVar15;
  byte *source_00;
  UConverter *pUVar16;
  uint uVar17;
  UConverter *pUVar18;
  byte *pbVar19;
  char tempBuf [2];
  byte *local_88;
  byte *local_80;
  UErrorCode *local_78;
  UConverterSharedData *local_70;
  UConverterToUnicodeArgs local_68;
  
  local_88 = (byte *)args->source;
  pUVar18 = args->converter;
  pbVar19 = (byte *)args->sourceLimit;
  pvVar2 = pUVar18->extraInfo;
  local_78 = err;
  if (*(int *)((long)pvVar2 + 0x6c) == 1) {
    local_70 = (UConverterSharedData *)&args->source;
    uVar17._0_2_ = args->size;
    uVar17._2_1_ = args->flush;
    uVar17._3_1_ = args->field_0x3;
    uVar13 = 0x38;
    if ((ushort)(undefined2)uVar17 < 0x38) {
      uVar13 = uVar17;
    }
    local_80 = local_88;
    memcpy(&local_68,args,(ulong)(uVar13 & 0xffff));
    source = local_70;
    pUVar5 = local_78;
    local_68.size = (uint16_t)uVar13;
    local_68.converter = *(UConverter **)((long)pvVar2 + 0x50);
    if (*(int *)((long)pvVar2 + 0x68) != 0) goto LAB_00322159;
    do {
      pUVar18 = local_68.converter;
      UVar6 = *pUVar5;
      if (U_ZERO_ERROR < UVar6) {
        return;
      }
      local_68.source = args->source;
      pcVar3 = args->sourceLimit;
      pcVar15 = local_68.source;
      if (pcVar3 <= local_68.source) {
        return;
      }
      do {
        local_68.sourceLimit = pcVar15;
        if (*pcVar15 == '\x1b') break;
        pcVar15 = pcVar15 + 1;
        local_68.sourceLimit = pcVar3;
      } while (pcVar15 != pcVar3);
      if (local_68.source != local_68.sourceLimit) {
        cVar10 = args->converter->toULength;
        if (0 < (long)cVar10) {
          memcpy((local_68.converter)->toUBytes,args->converter->toUBytes,(long)cVar10);
          cVar10 = args->converter->toULength;
        }
        pUVar18->toULength = cVar10;
        ucnv_MBCSToUnicodeWithOffsets_63(&local_68,pUVar5);
        pUVar18 = local_68.converter;
        piVar8 = args->offsets;
        if (((piVar8 != (int *)0x0) && (pbVar19 = *(byte **)source, local_88 != pbVar19)) &&
           (pUVar12 = args->target, pUVar12 < local_68.target)) {
          do {
            if (-1 < *piVar8) {
              *piVar8 = *piVar8 + ((int)pbVar19 - (int)local_88);
            }
            piVar8 = piVar8 + 1;
            pUVar12 = pUVar12 + 1;
          } while (pUVar12 < local_68.target);
        }
        args->source = local_68.source;
        args->target = local_68.target;
        args->offsets = local_68.offsets;
        cVar10 = (local_68.converter)->toULength;
        if (0 < (long)cVar10) {
          memcpy(args->converter->toUBytes,(local_68.converter)->toUBytes,(long)cVar10);
          cVar10 = pUVar18->toULength;
        }
        pUVar16 = args->converter;
        pUVar16->toULength = cVar10;
        UVar6 = *pUVar5;
        if (UVar6 == U_BUFFER_OVERFLOW_ERROR) {
          cVar10 = pUVar18->UCharErrorBufferLength;
          UVar6 = U_BUFFER_OVERFLOW_ERROR;
          if (0 < (long)cVar10) {
            memcpy(pUVar16->UCharErrorBuffer,pUVar18->UCharErrorBuffer,(long)cVar10);
            cVar10 = pUVar18->UCharErrorBufferLength;
            pUVar16 = args->converter;
            UVar6 = *pUVar5;
          }
          pUVar16->UCharErrorBufferLength = cVar10;
          pUVar18->UCharErrorBufferLength = '\0';
        }
      }
      if (U_ZERO_ERROR < UVar6) {
        return;
      }
      pbVar19 = (byte *)args->sourceLimit;
      if ((byte *)args->source == pbVar19) {
        return;
      }
      pUVar18 = args->converter;
LAB_00322159:
      changeState_2022(pUVar18,(char **)source,(char *)pbVar19,ISO_2022_KR,pUVar5);
    } while( true );
  }
  pUVar12 = args->target;
  local_70 = *(UConverterSharedData **)(*(long *)((long)pvVar2 + 0x50) + 0x30);
  useFallback = pUVar18->useFallback;
  local_80 = local_88;
  if (*(int *)((long)pvVar2 + 0x68) != 0) goto LAB_003221f0;
  if (pbVar19 <= local_88 || pUVar18->toULength != '\x01') goto LAB_00322174;
  if (args->targetLimit <= pUVar12) goto LAB_00322174;
  uVar17 = (uint)pUVar18->toUBytes[0];
  pUVar18->toULength = '\0';
LAB_00322248:
  bVar1 = *local_88;
  if ((((short)uVar17 + 0xdfU & 0xfe) < 0x5e) && ((byte)(bVar1 - 0x21) < 0x5e)) {
    local_80 = local_88 + 1;
    local_68.size = CONCAT11(bVar1,(char)uVar17 + -0x80) | 0x8000;
    iVar7 = ucnv_MBCSSimpleGetNextUChar_63(local_70,(char *)&local_68,2,useFallback);
    uVar17 = uVar17 << 8 | (uint)bVar1;
  }
  else {
    iVar7 = 0xffff;
    local_80 = local_88;
    if (((byte)(bVar1 - 0x21) < 0x5e) ||
       ((bVar1 < 0x20 && ((0x800c000U >> (bVar1 & 0x1f) & 1) != 0)))) goto LAB_003222dc;
    local_80 = local_88 + 1;
    uVar17 = uVar17 << 8 | (uint)bVar1;
  }
  local_88 = local_88 + 1;
LAB_003222dc:
  if (iVar7 < 0xfffe) {
    if (args->offsets != (int32_t *)0x0) {
      iVar14 = -1;
      if (0xff < uVar17) {
        iVar14 = -2;
      }
      *(int *)((long)args->offsets + ((long)pUVar12 - (long)args->target) * 2) =
           ((int)local_88 + iVar14) - *(int *)&args->source;
    }
    *pUVar12 = (UChar)iVar7;
    pUVar12 = pUVar12 + 1;
LAB_00322174:
    local_80 = local_88;
    if (local_88 < pbVar19) {
      pUVar4 = args->targetLimit;
      lVar9 = (long)pbVar19 - (long)local_88;
      source_00 = local_88;
      do {
        if (pUVar4 <= pUVar12) {
          *local_78 = U_BUFFER_OVERFLOW_ERROR;
          local_80 = local_88;
          break;
        }
        bVar1 = *source_00;
        uVar17 = (uint)bVar1;
        if (bVar1 == 0xe) {
          *(undefined1 *)((long)pvVar2 + 0x60) = 1;
          *(undefined1 *)((long)pvVar2 + 0x70) = 1;
        }
        else {
          if (bVar1 != 0xf) goto LAB_003221e2;
          *(undefined1 *)((long)pvVar2 + 0x60) = 0;
          if (*(char *)((long)pvVar2 + 0x70) != '\0') {
            *(undefined1 *)((long)pvVar2 + 0x70) = 0;
            *local_78 = U_ILLEGAL_ESCAPE_SEQUENCE;
            pUVar18 = args->converter;
            pUVar18->toUCallbackReason = UCNV_IRREGULAR;
            pUVar18->toUBytes[0] = '\x0f';
            args->converter->toULength = '\x01';
            args->target = pUVar12;
            args->source = (char *)(source_00 + 1);
            return;
          }
        }
        source_00 = source_00 + 1;
        lVar9 = lVar9 + -1;
        local_80 = pbVar19;
        if (lVar9 == 0) break;
      } while( true );
    }
    goto LAB_003221cb;
  }
  pUVar18 = args->converter;
  iVar11 = '\x01';
  uVar13 = uVar17;
  if (0xff < uVar17) {
    uVar13 = uVar17 >> 8;
    pUVar18->toUBytes[1] = (uint8_t)uVar17;
    iVar11 = '\x02';
  }
  pUVar18->toUBytes[0] = (uint8_t)uVar13;
  pUVar18->toULength = iVar11;
  *local_78 = (iVar7 != 0xfffe) + 10 + (uint)(iVar7 != 0xfffe);
  goto LAB_003221cb;
LAB_003221e2:
  if (bVar1 != 0x1b) goto LAB_00322226;
  pUVar18 = args->converter;
  local_80 = source_00;
LAB_003221f0:
  pUVar5 = local_78;
  *(undefined1 *)((long)pvVar2 + 0x70) = 0;
  changeState_2022(pUVar18,(char **)&local_80,(char *)pbVar19,ISO_2022_KR,local_78);
  local_88 = local_80;
  if (U_ZERO_ERROR < *pUVar5) goto LAB_003221cb;
  goto LAB_00322174;
LAB_00322226:
  local_88 = source_00 + 1;
  *(undefined1 *)((long)pvVar2 + 0x70) = 0;
  local_80 = local_88;
  if (*(char *)((long)pvVar2 + 0x60) != '\x01') {
    iVar7 = 0xffff;
    if (-1 < (char)bVar1) {
      iVar7 = ucnv_MBCSSimpleGetNextUChar_63(local_70,(char *)source_00,1,useFallback);
    }
    goto LAB_003222dc;
  }
  if (pbVar19 <= local_88) {
    args->converter->toUBytes[0] = bVar1;
    args->converter->toULength = '\x01';
LAB_003221cb:
    args->target = pUVar12;
    args->source = (char *)local_80;
    return;
  }
  goto LAB_00322248;
}

Assistant:

static void U_CALLCONV
UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC(UConverterToUnicodeArgs *args,
                                                            UErrorCode* err){
    char tempBuf[2];
    const char *mySource = ( char *) args->source;
    UChar *myTarget = args->target;
    const char *mySourceLimit = args->sourceLimit;
    UChar32 targetUniChar = 0x0000;
    UChar mySourceChar = 0x0000;
    UConverterDataISO2022* myData;
    UConverterSharedData* sharedData ;
    UBool useFallback;

    myData=(UConverterDataISO2022*)(args->converter->extraInfo);
    if(myData->version==1){
        UConverter_toUnicode_ISO_2022_KR_OFFSETS_LOGIC_IBM(args,err);
        return;
    }

    /* initialize state */
    sharedData = myData->currentConverter->sharedData;
    useFallback = args->converter->useFallback;

    if(myData->key != 0) {
        /* continue with a partial escape sequence */
        goto escape;
    } else if(args->converter->toULength == 1 && mySource < mySourceLimit && myTarget < args->targetLimit) {
        /* continue with a partial double-byte character */
        mySourceChar = args->converter->toUBytes[0];
        args->converter->toULength = 0;
        goto getTrailByte;
    }

    while(mySource< mySourceLimit){

        if(myTarget < args->targetLimit){

            mySourceChar= (unsigned char) *mySource++;

            if(mySourceChar==UCNV_SI){
                myData->toU2022State.g = 0;
                if (myData->isEmptySegment) {
                    myData->isEmptySegment = FALSE;	/* we are handling it, reset to avoid future spurious errors */
                    *err = U_ILLEGAL_ESCAPE_SEQUENCE;
                    args->converter->toUCallbackReason = UCNV_IRREGULAR;
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                /*consume the source */
                continue;
            }else if(mySourceChar==UCNV_SO){
                myData->toU2022State.g = 1;
                myData->isEmptySegment = TRUE;	/* Begin a new segment, empty so far */
                /*consume the source */
                continue;
            }else if(mySourceChar==ESC_2022){
                mySource--;
escape:
                myData->isEmptySegment = FALSE;	/* Any invalid ESC sequences will be detected separately, so just reset this */
                changeState_2022(args->converter,&(mySource),
                                mySourceLimit, ISO_2022_KR, err);
                if(U_FAILURE(*err)){
                    args->target = myTarget;
                    args->source = mySource;
                    return;
                }
                continue;
            }

            myData->isEmptySegment = FALSE;	/* Any invalid char errors will be detected separately, so just reset this */
            if(myData->toU2022State.g == 1) {
                if(mySource < mySourceLimit) {
                    int leadIsOk, trailIsOk;
                    uint8_t trailByte;
getTrailByte:
                    targetUniChar = missingCharMarker;
                    trailByte = (uint8_t)*mySource;
                    /*
                     * Ticket 5691: consistent illegal sequences:
                     * - We include at least the first byte in the illegal sequence.
                     * - If any of the non-initial bytes could be the start of a character,
                     *   we stop the illegal sequence before the first one of those.
                     *
                     * In ISO-2022 DBCS, if the second byte is in the 21..7e range or is
                     * an ESC/SO/SI, we report only the first byte as the illegal sequence.
                     * Otherwise we convert or report the pair of bytes.
                     */
                    leadIsOk = (uint8_t)(mySourceChar - 0x21) <= (0x7e - 0x21);
                    trailIsOk = (uint8_t)(trailByte - 0x21) <= (0x7e - 0x21);
                    if (leadIsOk && trailIsOk) {
                        ++mySource;
                        tempBuf[0] = (char)(mySourceChar + 0x80);
                        tempBuf[1] = (char)(trailByte + 0x80);
                        targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, tempBuf, 2, useFallback);
                        mySourceChar = (mySourceChar << 8) | trailByte;
                    } else if (!(trailIsOk || IS_2022_CONTROL(trailByte))) {
                        /* report a pair of illegal bytes if the second byte is not a DBCS starter */
                        ++mySource;
                        /* add another bit so that the code below writes 2 bytes in case of error */
                        mySourceChar = static_cast<UChar>(0x10000 | (mySourceChar << 8) | trailByte);
                    }
                } else {
                    args->converter->toUBytes[0] = (uint8_t)mySourceChar;
                    args->converter->toULength = 1;
                    break;
                }
            }
            else if(mySourceChar <= 0x7f) {
                targetUniChar = ucnv_MBCSSimpleGetNextUChar(sharedData, mySource - 1, 1, useFallback);
            } else {
                targetUniChar = 0xffff;
            }
            if(targetUniChar < 0xfffe){
                if(args->offsets) {
                    args->offsets[myTarget - args->target] = (int32_t)(mySource - args->source - (mySourceChar <= 0xff ? 1 : 2));
                }
                *(myTarget++)=(UChar)targetUniChar;
            }
            else {
                /* Call the callback function*/
                toUnicodeCallback(args->converter,mySourceChar,targetUniChar,err);
                break;
            }
        }
        else{
            *err =U_BUFFER_OVERFLOW_ERROR;
            break;
        }
    }
    args->target = myTarget;
    args->source = mySource;
}